

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_LE_Test::Body(iu_SyntaxTest_x_iutest_x_LE_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, LE)
{
    if( int x = 1 )
        IUTEST_ASSERT_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_LE(1, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_LE(1, x) << x;
}